

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgga.c
# Opt level: O3

void xc_mgga(xc_func_type *p,size_t np,double *rho,double *sigma,double *lapl,double *tau,double *zk
            ,double *vrho,double *vsigma,double *vlapl,double *vtau,double *v2rho2,
            double *v2rhosigma,double *v2rholapl,double *v2rhotau,double *v2sigma2,
            double *v2sigmalapl,double *v2sigmatau,double *v2lapl2,double *v2lapltau,double *v2tau2,
            double *v3rho3,double *v3rho2sigma,double *v3rho2lapl,double *v3rho2tau,
            double *v3rhosigma2,double *v3rhosigmalapl,double *v3rhosigmatau,double *v3rholapl2,
            double *v3rholapltau,double *v3rhotau2,double *v3sigma3,double *v3sigma2lapl,
            double *v3sigma2tau,double *v3sigmalapl2,double *v3sigmalapltau,double *v3sigmatau2,
            double *v3lapl3,double *v3lapl2tau,double *v3lapltau2,double *v3tau3,double *v4rho4,
            double *v4rho3sigma,double *v4rho3lapl,double *v4rho3tau,double *v4rho2sigma2,
            double *v4rho2sigmalapl,double *v4rho2sigmatau,double *v4rho2lapl2,double *v4rho2lapltau
            ,double *v4rho2tau2,double *v4rhosigma3,double *v4rhosigma2lapl,double *v4rhosigma2tau,
            double *v4rhosigmalapl2,double *v4rhosigmalapltau,double *v4rhosigmatau2,
            double *v4rholapl3,double *v4rholapl2tau,double *v4rholapltau2,double *v4rhotau3,
            double *v4sigma4,double *v4sigma3lapl,double *v4sigma3tau,double *v4sigma2lapl2,
            double *v4sigma2lapltau,double *v4sigma2tau2,double *v4sigmalapl3)

{
  int iVar1;
  int iVar2;
  xc_mgga_out_params local_250;
  
  iVar2 = 1;
  if (vrho == (double *)0x0) {
    iVar2 = -(uint)(zk == (double *)0x0);
  }
  iVar1 = 2;
  if (v2rho2 == (double *)0x0) {
    iVar1 = iVar2;
  }
  iVar2 = 3;
  if (v3rho3 == (double *)0x0) {
    iVar2 = iVar1;
  }
  iVar1 = 4;
  if (v4rho4 == (double *)0x0) {
    iVar1 = iVar2;
  }
  if (-1 < iVar1) {
    local_250.zk = zk;
    local_250.vrho = vrho;
    local_250.vsigma = vsigma;
    local_250.vlapl = vlapl;
    local_250.vtau = vtau;
    local_250.v2rho2 = v2rho2;
    local_250.v2rhosigma = v2rhosigma;
    local_250.v2rholapl = v2rholapl;
    local_250.v2rhotau = v2rhotau;
    local_250.v2sigma2 = v2sigma2;
    local_250.v2sigmalapl = v2sigmalapl;
    local_250.v2sigmatau = v2sigmatau;
    local_250.v2lapl2 = v2lapl2;
    local_250.v2lapltau = v2lapltau;
    local_250.v2tau2 = v2tau2;
    local_250.v3rho3 = v3rho3;
    local_250.v3rho2sigma = v3rho2sigma;
    local_250.v3rho2lapl = v3rho2lapl;
    local_250.v3rho2tau = v3rho2tau;
    local_250.v3rhosigma2 = v3rhosigma2;
    local_250.v3rhosigmalapl = v3rhosigmalapl;
    local_250.v3rhosigmatau = v3rhosigmatau;
    local_250.v3rholapl2 = v3rholapl2;
    local_250.v3rholapltau = v3rholapltau;
    local_250.v3rhotau2 = v3rhotau2;
    local_250.v3sigma3 = v3sigma3;
    local_250.v3sigma2lapl = v3sigma2lapl;
    local_250.v3sigma2tau = v3sigma2tau;
    local_250.v3sigmalapl2 = v3sigmalapl2;
    local_250.v3sigmalapltau = v3sigmalapltau;
    local_250.v3sigmatau2 = v3sigmatau2;
    local_250.v3lapl3 = v3lapl3;
    local_250.v3lapl2tau = v3lapl2tau;
    local_250.v3lapltau2 = v3lapltau2;
    local_250.v3tau3 = v3tau3;
    local_250.v4rho4 = v4rho4;
    local_250.v4rho3sigma = v4rho3sigma;
    local_250.v4rho3lapl = v4rho3lapl;
    local_250.v4rho3tau = v4rho3tau;
    local_250.v4rho2sigma2 = v4rho2sigma2;
    local_250.v4rho2sigmalapl = v4rho2sigmalapl;
    local_250.v4rho2sigmatau = v4rho2sigmatau;
    local_250.v4rho2lapl2 = v4rho2lapl2;
    local_250.v4rho2lapltau = v4rho2lapltau;
    local_250.v4rho2tau2 = v4rho2tau2;
    local_250.v4rhosigma3 = v4rhosigma3;
    local_250.v4rhosigma2lapl = v4rhosigma2lapl;
    local_250.v4rhosigma2tau = v4rhosigma2tau;
    local_250.v4rhosigmalapl2 = v4rhosigmalapl2;
    local_250.v4rhosigmalapltau = v4rhosigmalapltau;
    local_250.v4rhosigmatau2 = v4rhosigmatau2;
    local_250.v4rholapl3 = v4rholapl3;
    local_250.v4rholapl2tau = v4rholapl2tau;
    local_250.v4rholapltau2 = v4rholapltau2;
    local_250.v4rhotau3 = v4rhotau3;
    local_250.v4sigma4 = v4sigma4;
    local_250.v4sigma3lapl = v4sigma3lapl;
    local_250.v4sigma3tau = v4sigma3tau;
    local_250.v4sigma2lapl2 = v4sigma2lapl2;
    local_250.v4sigma2lapltau = v4sigma2lapltau;
    local_250.v4sigma2tau2 = v4sigma2tau2;
    local_250.v4sigmalapl3 = v4sigmalapl3;
    xc_mgga_new(p,iVar1,np,rho,sigma,lapl,tau,&local_250);
  }
  return;
}

Assistant:

void
xc_mgga(const xc_func_type *p, size_t np,
        const double *rho, const double *sigma, const double *lapl, const double *tau,
        double *zk,
        double *vrho, double *vsigma, double *vlapl, double *vtau,
        double *v2rho2, double *v2rhosigma, double *v2rholapl, double *v2rhotau, double *v2sigma2,
        double *v2sigmalapl, double *v2sigmatau, double *v2lapl2, double *v2lapltau, double *v2tau2,
        double *v3rho3, double *v3rho2sigma, double *v3rho2lapl, double *v3rho2tau, double *v3rhosigma2,
        double *v3rhosigmalapl, double *v3rhosigmatau, double *v3rholapl2, double *v3rholapltau,
        double *v3rhotau2, double *v3sigma3, double *v3sigma2lapl, double *v3sigma2tau,
        double *v3sigmalapl2, double *v3sigmalapltau, double *v3sigmatau2, double *v3lapl3,
        double *v3lapl2tau, double *v3lapltau2, double *v3tau3,
        double *v4rho4, double *v4rho3sigma, double *v4rho3lapl, double *v4rho3tau, double *v4rho2sigma2,
        double *v4rho2sigmalapl, double *v4rho2sigmatau, double *v4rho2lapl2, double *v4rho2lapltau,
        double *v4rho2tau2, double *v4rhosigma3, double *v4rhosigma2lapl, double *v4rhosigma2tau,
        double *v4rhosigmalapl2, double *v4rhosigmalapltau, double *v4rhosigmatau2,
        double *v4rholapl3, double *v4rholapl2tau, double *v4rholapltau2, double *v4rhotau3,
        double *v4sigma4, double *v4sigma3lapl, double *v4sigma3tau, double *v4sigma2lapl2,
        double *v4sigma2lapltau, double *v4sigma2tau2, double *v4sigmalapl3, double *v4sigmalapl2tau,
        double *v4sigmalapltau2, double *v4sigmatau3, double *v4lapl4, double *v4lapl3tau,
        double *v4lapl2tau2, double *v4lapltau3, double *v4tau4
        )
{
  int order = -1;

  if(zk     != NULL) order = 0;
  if(vrho   != NULL) order = 1;
  if(v2rho2 != NULL) order = 2;
  if(v3rho3 != NULL) order = 3;
  if(v4rho4 != NULL) order = 4;

  if(order < 0) return;

  xc_mgga_out_params out;
  libxc_memset(&out, 0, sizeof(xc_mgga_out_params));

  SET_ORDER_0;
  SET_ORDER_1;
  SET_ORDER_2;
  SET_ORDER_3;
  SET_ORDER_4;

  /* call new API */
  xc_mgga_new(p, order, np, rho, sigma, lapl, tau, &out);
}